

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

bool __thiscall r_comp::Preprocessor::isSet(Preprocessor *this,string *className)

{
  bool bVar1;
  __type _Var2;
  element_type *peVar3;
  reference psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  int local_58;
  undefined1 local_48 [8];
  Ptr replistruct;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
  *__range1;
  string *className_local;
  Preprocessor *this_local;
  
  peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::
           vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
           ::begin(&peVar3->args);
  replistruct.super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>
         ::end(&peVar3->args);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
                                     *)&replistruct.
                                        super___shared_ptr<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount), bVar1) {
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<r_comp::RepliStruct>::shared_ptr
              ((shared_ptr<r_comp::RepliStruct> *)local_48,psVar4);
    peVar3 = std::__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    if (peVar3->type == Directive) {
      peVar3 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      bVar1 = std::operator!=(&peVar3->cmd,"!class");
      if (bVar1) goto LAB_001bb157;
      peVar3 = std::
               __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
      _Var2 = std::operator==(&peVar3->cmd,className);
      if (_Var2) {
        this_local._7_1_ = 0;
        local_58 = 1;
      }
      else {
        peVar3 = std::
                 __shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<r_comp::RepliStruct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_48);
        std::operator+(local_78,(char *)className);
        _Var2 = std::operator==(&peVar3->cmd,local_78);
        std::__cxx11::string::~string((string *)local_78);
        if (_Var2) {
          this_local._7_1_ = 1;
          local_58 = 1;
        }
        else {
          local_58 = 0;
        }
      }
    }
    else {
LAB_001bb157:
      local_58 = 3;
    }
    std::shared_ptr<r_comp::RepliStruct>::~shared_ptr((shared_ptr<r_comp::RepliStruct> *)local_48);
    if ((local_58 != 0) && (local_58 == 1)) goto LAB_001bb24d;
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<r_comp::RepliStruct>_*,_std::vector<std::shared_ptr<r_comp::RepliStruct>,_std::allocator<std::shared_ptr<r_comp::RepliStruct>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 0;
LAB_001bb24d:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool Preprocessor::isSet(std::string className)
{
    for(RepliStruct::Ptr replistruct : root->args) {
        if (replistruct->type != RepliStruct::Directive || replistruct->cmd != "!class") {
            continue;
        }

        if (replistruct->cmd == className) { // set classes are written class_name[].
            return false;
        }

        if (replistruct->cmd == className + "[]") {
            return true;
        }
    }

    return false;
}